

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O2

Abc_Des_t * Abc_DesDupBlackboxes(Abc_Des_t *p,Abc_Ntk_t *pNtkSave)

{
  Vec_Ptr_t *p_00;
  Abc_Des_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  int i;
  
  if (p->vTops->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vTops) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLib.c"
                  ,0xaa,"Abc_Des_t *Abc_DesDupBlackboxes(Abc_Des_t *, Abc_Ntk_t *)");
  }
  if (1 < p->vModules->nSize) {
    pAVar1 = Abc_DesCreate(p->pName);
    Vec_PtrPush(pAVar1->vTops,pNtkSave);
    p_00 = pAVar1->vModules;
    Vec_PtrPush(p_00,pNtkSave);
    for (i = 0; i < p->vModules->nSize; i = i + 1) {
      pAVar2 = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,i);
      if (pAVar2->ntkFunc == ABC_FUNC_BLACKBOX) {
        pAVar2 = Abc_NtkDup(pAVar2);
        Vec_PtrPush(p_00,pAVar2);
      }
    }
    return pAVar1;
  }
  __assert_fail("Vec_PtrSize(p->vModules) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLib.c"
                ,0xab,"Abc_Des_t *Abc_DesDupBlackboxes(Abc_Des_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave )
{
    Abc_Des_t * pNew;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Vec_PtrSize(p->vTops) > 0 );
    assert( Vec_PtrSize(p->vModules) > 1 );
    pNew = Abc_DesCreate( p->pName );
//    pNew->pManFunc = pNtkSave->pManFunc;
    Vec_PtrPush( pNew->vTops, pNtkSave );
    Vec_PtrPush( pNew->vModules, pNtkSave );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtkTemp, i )
        if ( Abc_NtkHasBlackbox( pNtkTemp ) )
            Vec_PtrPush( pNew->vModules, Abc_NtkDup(pNtkTemp) );
    return pNew;
}